

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

ZoneState *
QDateTimePrivate::localStateAtMillis
          (ZoneState *__return_storage_ptr__,qint64 millis,TransitionOptions resolve)

{
  bool bVar1;
  int iVar2;
  long local;
  long lVar3;
  long in_FS_OFFSET;
  R_conflict17 RVar4;
  QTimeZone sys;
  Data local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((millisInSystemRange(long_long,long_long)::bounds == '\0') &&
     (iVar2 = __cxa_guard_acquire(&millisInSystemRange(long_long,long_long)::bounds), iVar2 != 0)) {
    QLocalTime::computeSystemMillisRange();
    __cxa_guard_release(&millisInSystemRange(long_long,long_long)::bounds);
  }
  if (((DAT_006b4980 != '\0') ||
      (millisInSystemRange(long_long,long_long)::bounds + -86400000 <= millis)) &&
     ((DAT_006b4981 != '\0' || (millis <= DAT_006b4978 + 86400000)))) {
    *(undefined1 **)&__return_storage_ptr__->valid = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->when = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&__return_storage_ptr__->offset = &DAT_aaaaaaaaaaaaaaaa;
    QLocalTime::mapLocalTime(__return_storage_ptr__,millis,resolve);
    if (__return_storage_ptr__->valid != false) goto LAB_00347e38;
  }
  local_38.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::systemTimeZone();
  bVar1 = QTimeZone::isValid((QTimeZone *)&local_38.s);
  if (bVar1) {
    QTimeZonePrivate::stateAtZoneTime(__return_storage_ptr__,local_38.d,millis,resolve);
  }
  else {
    RVar4 = millisToWithinRange(millis);
    local = RVar4.shifted;
    if (((undefined1  [16])RVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __return_storage_ptr__->when = millis;
      __return_storage_ptr__->offset = 0;
      __return_storage_ptr__->dst = UnknownDaylightTime;
      __return_storage_ptr__->valid = false;
    }
    else {
      *(undefined1 **)&__return_storage_ptr__->valid = &DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->when = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->offset = &DAT_aaaaaaaaaaaaaaaa;
      QLocalTime::mapLocalTime(__return_storage_ptr__,local,resolve);
      if (__return_storage_ptr__->valid == true) {
        lVar3 = (millis - local) + __return_storage_ptr__->when;
        if ((SCARRY8(millis - local,__return_storage_ptr__->when)) &&
           (lVar3 = -0x8000000000000000, local <= millis)) {
          lVar3 = 0x7fffffffffffffff;
        }
        __return_storage_ptr__->when = lVar3;
      }
      else {
        __return_storage_ptr__->when = millis;
      }
    }
  }
  QTimeZone::~QTimeZone((QTimeZone *)&local_38.s);
LAB_00347e38:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QDateTimePrivate::ZoneState QDateTimePrivate::localStateAtMillis(
    qint64 millis, QDateTimePrivate::TransitionOptions resolve)
{
    // First, if millis is within a day of the viable range, try mktime() in
    // case it does fall in the range and gets useful information:
    if (millisInSystemRange(millis, MSECS_PER_DAY)) {
        auto result = QLocalTime::mapLocalTime(millis, resolve);
        if (result.valid)
            return result;
    }

    // Otherwise, outside the system range.
#if QT_CONFIG(timezone)
    // Use the system zone:
    const auto sys = QTimeZone::systemTimeZone();
    if (sys.isValid())
        return zoneStateAtMillis(sys, millis, resolve);
#endif // timezone

    // Kludge
    // Use a time in the system range with the same day-of-week pattern to its year:
    auto fake = millisToWithinRange(millis);
    if (Q_LIKELY(fake.good)) {
        auto result = QLocalTime::mapLocalTime(fake.shifted, resolve);
        if (result.valid) {
            qint64 adjusted;
            if (Q_UNLIKELY(qAddOverflow(result.when, millis - fake.shifted, &adjusted))) {
                using Bound = std::numeric_limits<qint64>;
                adjusted = millis < fake.shifted ? Bound::min() : Bound::max();
            }
            result.when = adjusted;
        } else {
            result.when = millis;
        }
        return result;
    }
    // Overflow, apparently.
    return {millis};
}